

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_file_hash.c
# Opt level: O1

void test_open_address_file_hashmap_compute_simple_hash(planck_unit_test_t *tc)

{
  bool bVar1;
  planck_unit_result_t pVar2;
  ion_err_t iVar3;
  ion_hash_t iVar4;
  int iVar5;
  ion_file_hashmap_t map;
  int local_6c;
  ion_file_hashmap_t local_68;
  
  local_68.super.key_type = key_type_numeric_signed;
  local_68.super.compare = dictionary_compare_signed_value;
  local_68.super.id = 0;
  oafh_initialize(&local_68,oafh_compute_simple_hash,key_type_numeric_signed,4,10,10,0);
  local_6c = 0;
  do {
    iVar5 = local_6c % local_68.map_size;
    iVar4 = oafh_compute_simple_hash(&local_68,&local_6c,4);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(iVar5 == iVar4),0x9d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_file_hash/test_open_address_file_hash.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') goto LAB_001016d3;
    iVar5 = local_6c + 1;
    bVar1 = local_6c < 99;
    local_6c = iVar5;
  } while (bVar1);
  iVar3 = oafh_destroy(&local_68);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar3 == '\0'),0xa0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_file_hash/test_open_address_file_hash.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    return;
  }
LAB_001016d3:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_file_hashmap_compute_simple_hash(
	planck_unit_test_t *tc
) {
	ion_file_hashmap_t	map;		/* create handler for hashmap */
	int					i;

	initialize_file_hash_map_std_conditions(&map);

	for (i = 0; i < ION_MAX_HASH_TEST; i++) {
		PLANCK_UNIT_ASSERT_TRUE(tc, (i % map.map_size) == oafh_compute_simple_hash(&map, ((int *) &i), sizeof(i)));
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oafh_destroy(&map));
}